

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::(anonymous_namespace)::TwoWayPipeEnd> __thiscall
kj::
heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncPipe> *params,
          Own<kj::(anonymous_namespace)::AsyncPipe> *params_1)

{
  Disposer *pDVar1;
  AsyncPipe *pAVar2;
  Disposer *pDVar3;
  AsyncPipe *pAVar4;
  undefined8 *puVar5;
  TwoWayPipeEnd *extraout_RDX;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> OVar6;
  
  puVar5 = (undefined8 *)operator_new(0x38);
  pDVar1 = params->disposer;
  pAVar2 = params->ptr;
  params->ptr = (AsyncPipe *)0x0;
  pDVar3 = params_1->disposer;
  pAVar4 = params_1->ptr;
  params_1->ptr = (AsyncPipe *)0x0;
  *puVar5 = &PTR_read_00468868;
  puVar5[1] = &PTR_write_004688e8;
  puVar5[2] = pDVar1;
  puVar5[3] = pAVar2;
  puVar5[4] = pDVar3;
  puVar5[5] = pAVar4;
  UnwindDetector::UnwindDetector((UnwindDetector *)(puVar5 + 6));
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::instance;
  *(undefined8 **)(this + 8) = puVar5;
  OVar6.ptr = extraout_RDX;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}